

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  uint8_t uVar1;
  ushort uVar2;
  allocated_headers *paVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  paVar3 = (wsi->http).ah;
  uVar7 = 0;
  if ((paVar3 != (allocated_headers *)0x0) && (bVar4 = paVar3->frag_index[h], bVar4 != 0)) {
    uVar7 = 0;
    do {
      uVar9 = (ulong)bVar4;
      bVar4 = paVar3->frags[bVar4].nfrag;
      uVar7 = (uint)(bVar4 != 0 && h != WSI_TOKEN_HTTP_COOKIE) + paVar3->frags[uVar9].len + uVar7;
    } while (bVar4 != 0);
  }
  *dst = '\0';
  uVar8 = 0;
  if (uVar7 != 0) {
    if (((int)uVar7 < len) && (paVar3 = (wsi->http).ah, paVar3 != (allocated_headers *)0x0)) {
      bVar4 = paVar3->frag_index[h];
      uVar9 = (ulong)bVar4;
      if (h == WSI_TOKEN_HTTP_URI_ARGS) {
        _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n","lws_hdr_copy",uVar9);
      }
      if (bVar4 != 0) {
        cVar5 = ',';
        if (h == WSI_TOKEN_HTTP_URI_ARGS) {
          cVar5 = '&';
        }
        do {
          paVar3 = (wsi->http).ah;
          uVar1 = paVar3->frags[uVar9].nfrag;
          if (h == WSI_TOKEN_HTTP_URI_ARGS) {
            _lws_log(4,"%s: WSI_TOKEN_HTTP_URI_ARGS \'%.*s\'\n","lws_hdr_copy",
                     (ulong)paVar3->frags[uVar9].len,paVar3->data + paVar3->frags[uVar9].offset);
          }
          paVar3 = (wsi->http).ah;
          uVar2 = paVar3->frags[uVar9].len;
          if (len <= (int)((uint)(uVar1 != '\0') + (uint)uVar2)) {
            _lws_log(4,"blowout len\n");
            goto LAB_0011cb56;
          }
          strncpy(dst,paVar3->data + paVar3->frags[uVar9].offset,(ulong)uVar2);
          paVar3 = (wsi->http).ah;
          uVar2 = paVar3->frags[uVar9].len;
          dst = dst + uVar2;
          bVar4 = paVar3->frags[uVar9].nfrag;
          uVar9 = (ulong)bVar4;
          if (uVar1 != '\0') {
            cVar6 = ';';
            if ((h != WSI_TOKEN_HTTP_COOKIE) && (h != WSI_TOKEN_HTTP_SET_COOKIE)) {
              cVar6 = cVar5;
            }
            *dst = cVar6;
            dst = dst + 1;
          }
          len = len - (uint)uVar2;
        } while (bVar4 != 0);
        *dst = '\0';
        uVar8 = uVar7;
        if (h == WSI_TOKEN_HTTP_URI_ARGS) {
          _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n","lws_hdr_copy",(ulong)uVar7);
        }
      }
    }
    else {
LAB_0011cb56:
      uVar8 = 0xffffffff;
    }
  }
  return uVar8;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n", __func__, n);


	if (!n)
		return 0;
	do {
		comma = (wsi->http.ah->frags[n].nfrag) ? 1 : 0;

		if (h == WSI_TOKEN_HTTP_URI_ARGS)
			lwsl_notice("%s: WSI_TOKEN_HTTP_URI_ARGS '%.*s'\n", __func__, (int)wsi->http.ah->frags[n].len, &wsi->http.ah->data[wsi->http.ah->frags[n].offset]);

		if (wsi->http.ah->frags[n].len + comma >= len) {
			lwsl_notice("blowout len\n");
			return -1;
		}
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma) {
			if (h == WSI_TOKEN_HTTP_COOKIE || h == WSI_TOKEN_HTTP_SET_COOKIE)
				*dst++ = ';';
			else
				if (h == WSI_TOKEN_HTTP_URI_ARGS)
					*dst++ = '&';
				else
					*dst++ = ',';
		}
				
	} while (n);
	*dst = '\0';

	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n", __func__, (int)toklen);

	return toklen;
}